

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O2

Aig_Man_t * Aig_ManExtractMiter(Aig_Man_t *p,Aig_Obj_t *pNode1,Aig_Obj_t *pNode2)

{
  Aig_Man_t *pNew;
  char *pcVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  
  pNew = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = Abc_UtilStrsav(p->pName);
  pNew->pName = pcVar1;
  pcVar1 = Abc_UtilStrsav(p->pSpec);
  pNew->pSpec = pcVar1;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  for (iVar4 = 0; iVar4 < p->vCis->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,iVar4);
    pAVar3 = Aig_ObjCreateCi(pNew);
    *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
  }
  Aig_ManDup_rec(pNew,p,pNode1);
  Aig_ManDup_rec(pNew,p,pNode2);
  pAVar3 = Aig_Exor(pNew,(Aig_Obj_t *)(pNode1->field_5).pData,(Aig_Obj_t *)(pNode2->field_5).pData);
  Aig_ObjCreateCo(pNew,(Aig_Obj_t *)
                       ((ulong)(((uint)pAVar3 ^
                                *(uint *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) ^
                       (ulong)pAVar3));
  iVar4 = Aig_ManCheck(pNew);
  if (iVar4 == 0) {
    puts("Aig_ManExtractMiter(): The check has failed.");
  }
  return pNew;
}

Assistant:

Aig_Man_t * Aig_ManExtractMiter( Aig_Man_t * p, Aig_Obj_t * pNode1, Aig_Obj_t * pNode2 )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    // dump the nodes
    Aig_ManDup_rec( pNew, p, pNode1 );   
    Aig_ManDup_rec( pNew, p, pNode2 );   
    // construct the EXOR
    pObj = Aig_Exor( pNew, (Aig_Obj_t *)pNode1->pData, (Aig_Obj_t *)pNode2->pData ); 
    pObj = Aig_NotCond( pObj, Aig_Regular(pObj)->fPhase ^ Aig_IsComplement(pObj) );
    // add the PO
    Aig_ObjCreateCo( pNew, pObj );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManExtractMiter(): The check has failed.\n" );
    return pNew;
}